

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O3

void do_cmd_wiz_query_square_flag(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t flag;
  char c;
  wchar_t local_10;
  byte local_9;
  
  local_10 = L'\0';
  wVar2 = cmd_get_arg_choice((command_conflict *)cmd,"choice",&local_10);
  if (wVar2 != L'\0') {
    _Var1 = get_com("Debug Command Query [grasvwdftniolx]: ",(char *)&local_9);
    if (!_Var1) {
      return;
    }
    switch(local_9) {
    case 0x61:
      local_10 = L'\x03';
      break;
    default:
      break;
    case 100:
      local_10 = L'\x13';
      break;
    case 0x66:
      local_10 = L'\b';
      break;
    case 0x67:
      local_10 = L'\x02';
      break;
    case 0x69:
      local_10 = L'\v';
      break;
    case 0x6c:
      local_10 = L'\r';
      break;
    case 0x6e:
      local_10 = L'\n';
      break;
    case 0x6f:
      local_10 = L'\f';
      break;
    case 0x72:
      local_10 = L'\x04';
      break;
    case 0x73:
      local_10 = L'\x05';
      break;
    case 0x74:
      local_10 = L'\t';
      break;
    case 0x76:
      local_10 = L'\x06';
      break;
    case 0x77:
      local_10 = L'\a';
      break;
    case 0x78:
      local_10 = L'\x0e';
    }
    cmd_set_arg_choice((command_conflict *)cmd,"choice",local_10);
  }
  wiz_hack_map((chunk *)cave,player,wiz_hack_map_query_square_flag,&local_10);
  Term_redraw();
  msg("Press any key.");
  inkey_ex();
  prt("",L'\0',L'\0');
  prt_map();
  return;
}

Assistant:

void do_cmd_wiz_query_square_flag(struct command *cmd)
{
	int flag = 0;

	if (cmd_get_arg_choice(cmd, "choice", &flag) != CMD_OK) {
		char c;

		if (!get_com("Debug Command Query [grasvwdftniolx]: ", &c))
			return;
		switch (c) {
			case 'g': flag = SQUARE_GLOW; break;
			case 'r': flag = SQUARE_ROOM; break;
			case 'a': flag = SQUARE_VAULT; break;
			case 's': flag = SQUARE_SEEN; break;
			case 'v': flag = SQUARE_VIEW; break;
			case 'w': flag = SQUARE_WASSEEN; break;
			case 'd': flag = SQUARE_DTRAP; break;
			case 'f': flag = SQUARE_FEEL; break;
			case 't': flag = SQUARE_TRAP; break;
			case 'n': flag = SQUARE_INVIS; break;
			case 'i': flag = SQUARE_WALL_INNER; break;
			case 'o': flag = SQUARE_WALL_OUTER; break;
			case 'l': flag = SQUARE_WALL_SOLID; break;
			case 'x': flag = SQUARE_MON_RESTRICT; break;
		}
		cmd_set_arg_choice(cmd, "choice", flag);
	}

	wiz_hack_map(cave, player, wiz_hack_map_query_square_flag, &flag);

	Term_redraw();

	msg("Press any key.");
	inkey_ex();
	prt("", 0, 0);

	/* Redraw map */
	prt_map();
}